

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

vm_obj_id_t CVmObjIterLookupTable::create_for_coll(vm_val_t *coll)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  vm_obj_id_t obj_id;
  int iVar4;
  undefined8 *puVar5;
  undefined4 extraout_var;
  
  pvVar3 = sp_;
  uVar2 = *(undefined4 *)&coll->field_0x4;
  aVar1 = coll->val;
  sp_ = sp_ + 1;
  pvVar3->typ = coll->typ;
  *(undefined4 *)&pvVar3->field_0x4 = uVar2;
  pvVar3->val = aVar1;
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,1,1);
  puVar5 = (undefined8 *)CVmObject::operator_new(0x10,obj_id);
  *puVar5 = &PTR_get_metaclass_reg_0036ee70;
  iVar4 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,9,puVar5);
  puVar5[1] = (char *)CONCAT44(extraout_var,iVar4);
  vmb_put_dh((char *)CONCAT44(extraout_var,iVar4),coll);
  *(undefined2 *)(puVar5[1] + 7) = 0;
  *(undefined2 *)(puVar5[1] + 5) = 0;
  sp_ = sp_ + -1;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjIterLookupTable::create_for_coll(VMG_ const vm_val_t *coll)
{
    vm_obj_id_t id;

    /* push the collection object reference for gc protection */
    G_stk->push(coll);

    /* create a non-root-set object */
    id = vm_new_id(vmg_ FALSE, TRUE, TRUE);

    /* instantiate the iterator */
    new (vmg_ id) CVmObjIterLookupTable(vmg_ coll);

    /* done with the gc protection */
    G_stk->discard();

    /* return the new object's ID */
    return id;
}